

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O2

void aom_highbd_quantize_b_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint *puVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  short sVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  int i;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  __m128i *palVar18;
  ulong uVar19;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  __m128i *qcoeff1;
  __m128i *qcoeff0;
  int *piVar20;
  long lVar21;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 uVar22;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined1 auVar23 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar26;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  __m128i alVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  __m128i mask;
  __m128i mask_00;
  __m128i dequant;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i alVar42;
  uint local_1b0;
  int is_found0;
  undefined1 local_1a8 [16];
  int log_scale;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  tran_low_t *local_160;
  undefined1 local_158 [4];
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 local_148 [4];
  ushort uStack_144;
  ushort uStack_142;
  ushort uStack_140;
  ushort uStack_13e;
  ushort uStack_13c;
  ushort uStack_13a;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  undefined1 local_118 [8];
  undefined4 uStack_110;
  undefined1 local_108 [8];
  uint uStack_100;
  uint uStack_fc;
  int thresh [4];
  undefined1 local_e8 [8];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [16];
  __m128i mask0;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [8];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  int16_t *local_98;
  intptr_t local_90;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  __m128i threshold [2];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  
  log_scale = 0;
  is_found0 = 0;
  mask0[0] = 0;
  mask0[1] = 0;
  for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
    thresh[lVar16] = (dequant_ptr[lVar16] * 0x145 + 0x40 >> 7) + zbin_ptr[lVar16] * 0x20 + -1;
  }
  thresh[3] = thresh[1];
  thresh[2] = thresh[1];
  auVar9._4_4_ = thresh[1];
  auVar9._0_4_ = thresh[1];
  auVar9._8_4_ = thresh[1];
  _local_148 = auVar9._4_8_;
  register0x00001208 = thresh[1];
  register0x0000120c = thresh[1];
  auVar30 = *(undefined1 (*) [16])zbin_ptr;
  auVar28 = *(undefined1 (*) [16])round_ptr;
  auVar34 = *(undefined1 (*) [16])quant_ptr;
  local_188 = *(undefined1 (*) [16])dequant_ptr;
  auVar3 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar27 = psraw(auVar30,0xf);
  auVar29 = psraw(auVar28,0xf);
  auVar31 = psraw(auVar34,0xf);
  local_68 = psraw(local_188,0xf);
  auVar33 = psraw(auVar3,0xf);
  auVar25._0_12_ = auVar30._0_12_;
  auVar25._12_2_ = auVar30._6_2_;
  auVar25._14_2_ = auVar27._6_2_;
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = auVar30._0_10_;
  auVar24._10_2_ = auVar27._4_2_;
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._0_8_ = auVar30._0_8_;
  auVar23._8_2_ = auVar30._4_2_;
  auVar8._4_8_ = auVar23._8_8_;
  auVar8._2_2_ = auVar27._2_2_;
  auVar8._0_2_ = auVar30._2_2_;
  auVar41._0_12_ = auVar28._0_12_;
  auVar41._12_2_ = auVar28._6_2_;
  auVar41._14_2_ = auVar29._6_2_;
  auVar40._12_4_ = auVar41._12_4_;
  auVar40._0_10_ = auVar28._0_10_;
  auVar40._10_2_ = auVar29._4_2_;
  auVar39._10_6_ = auVar40._10_6_;
  auVar39._0_8_ = auVar28._0_8_;
  auVar39._8_2_ = auVar28._4_2_;
  register0x000013c8 = auVar39._8_8_;
  local_118._6_2_ = auVar29._2_2_;
  local_118._4_2_ = auVar28._2_2_;
  local_118._0_2_ = auVar28._0_2_;
  local_118._2_2_ = auVar29._0_2_;
  auVar38._0_12_ = auVar34._0_12_;
  auVar38._12_2_ = auVar34._6_2_;
  auVar38._14_2_ = auVar31._6_2_;
  auVar37._12_4_ = auVar38._12_4_;
  auVar37._0_10_ = auVar34._0_10_;
  auVar37._10_2_ = auVar31._4_2_;
  auVar36._10_6_ = auVar37._10_6_;
  auVar36._0_8_ = auVar34._0_8_;
  auVar36._8_2_ = auVar34._4_2_;
  register0x00001388 = auVar36._8_8_;
  uStack_154._2_2_ = auVar31._2_2_;
  uStack_154._0_2_ = auVar34._2_2_;
  local_158._0_2_ = auVar34._0_2_;
  local_158._2_2_ = auVar31._0_2_;
  auVar29._0_12_ = auVar3._0_12_;
  auVar29._12_2_ = auVar3._6_2_;
  auVar29._14_2_ = auVar33._6_2_;
  auVar35._12_4_ = auVar29._12_4_;
  auVar35._0_10_ = auVar3._0_10_;
  auVar35._10_2_ = auVar33._4_2_;
  auVar31._10_6_ = auVar35._10_6_;
  auVar31._0_8_ = auVar3._0_8_;
  auVar31._8_2_ = auVar3._4_2_;
  register0x00001348 = auVar31._8_8_;
  local_108._6_2_ = auVar33._2_2_;
  local_108._4_2_ = auVar3._2_2_;
  local_108._0_2_ = auVar3._0_2_;
  local_108._2_2_ = auVar33._0_2_;
  local_d8._4_4_ = auVar8._0_4_ + -1;
  local_d8._0_4_ = CONCAT22(auVar27._0_2_,auVar30._0_2_) + -1;
  local_d8._8_4_ = auVar23._8_4_ + -1;
  local_d8._12_4_ = auVar24._12_4_ + -1;
  local_88 = *coeff_ptr >> 0x1f;
  uStack_84 = coeff_ptr[1] >> 0x1f;
  uStack_80 = coeff_ptr[2] >> 0x1f;
  uStack_7c = coeff_ptr[3] >> 0x1f;
  local_78 = coeff_ptr[4] >> 0x1f;
  uStack_74 = coeff_ptr[5] >> 0x1f;
  uStack_70 = coeff_ptr[6] >> 0x1f;
  uStack_6c = coeff_ptr[7] >> 0x1f;
  local_128 = (*coeff_ptr ^ local_88) - local_88;
  uStack_124 = (coeff_ptr[1] ^ uStack_84) - uStack_84;
  uStack_120 = (coeff_ptr[2] ^ uStack_80) - uStack_80;
  uStack_11c = (coeff_ptr[3] ^ uStack_7c) - uStack_7c;
  local_178._4_4_ = uStack_124;
  local_178._0_4_ = local_128;
  local_178._8_4_ = uStack_120;
  local_178._12_4_ = uStack_11c;
  qcoeff0 = (__m128i *)&local_128;
  local_138 = (coeff_ptr[4] ^ local_78) - local_78;
  uStack_134 = (coeff_ptr[5] ^ uStack_74) - uStack_74;
  uStack_130 = (coeff_ptr[6] ^ uStack_70) - uStack_70;
  uStack_12c = (coeff_ptr[7] ^ uStack_6c) - uStack_6c;
  local_1a8._4_4_ = uStack_134;
  local_1a8._0_4_ = local_138;
  local_1a8._8_4_ = uStack_130;
  local_1a8._12_4_ = uStack_12c;
  qcoeff1 = (__m128i *)&local_138;
  local_160 = coeff_ptr;
  _local_e8 = _local_158;
  _local_b8 = _local_108;
  _local_a8 = _local_118;
  local_90 = n_coeffs;
  threshold[1] = _local_148;
  highbd_update_mask0(qcoeff0,qcoeff1,threshold,iscan,&is_found0,&mask0);
  auVar34._0_4_ = -(uint)(local_d8._0_4_ < (int)local_178._0_4_);
  auVar34._4_4_ = -(uint)(local_d8._4_4_ < (int)local_178._4_4_);
  auVar34._8_4_ = -(uint)((int)local_d8._8_4_ < (int)local_178._8_4_);
  auVar34._12_4_ = -(uint)((int)local_d8._12_4_ < (int)local_178._12_4_);
  local_d8._0_8_ = local_d8._8_8_;
  auVar28._0_4_ = -(uint)((int)local_d8._8_4_ < (int)local_1a8._0_4_);
  auVar28._4_4_ = -(uint)((int)local_d8._12_4_ < (int)local_1a8._4_4_);
  auVar28._8_4_ = -(uint)((int)local_d8._8_4_ < (int)local_1a8._8_4_);
  auVar28._12_4_ = -(uint)((int)local_d8._12_4_ < (int)local_1a8._12_4_);
  auVar30 = packssdw(auVar34,auVar28);
  uVar5 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar30[0xf] >> 7) << 0xf;
  uVar14 = (uint)uVar5;
  if (uVar5 == 0) {
    auVar30 = (undefined1  [16])0x0;
  }
  else {
    uVar14 = 1;
    auVar30 = auVar30 & *(undefined1 (*) [16])iscan;
  }
  local_1b0 = (uint)(uVar5 != 0);
  uVar10 = local_188._2_2_;
  uVar11 = local_188._4_2_;
  uVar12 = local_188._6_2_;
  threshold[0][0] = _local_148;
  threshold[0][1] = _uStack_140;
  iVar13 = movmskps(uVar14,auVar28 | auVar34);
  local_98 = zbin_ptr;
  if (iVar13 == 0) {
    uVar22 = 0;
    uVar26 = 0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    local_a8._4_4_ = local_118._4_4_;
    local_a8._0_4_ = uStack_110;
    uStack_a0 = uStack_110;
    uStack_9c = local_118._4_4_;
    local_e8._4_4_ = uStack_154;
    local_e8._0_4_ = uStack_150;
    uStack_e0 = uStack_150;
    uStack_dc = uStack_154;
    local_b8._4_4_ = local_108._4_4_;
    local_b8._0_4_ = uStack_100;
    uStack_b0 = uStack_100;
    uStack_ac = local_108._4_4_;
    local_158._2_2_ = local_68._4_2_;
    local_158._0_2_ = local_188._4_2_;
    uStack_154._0_2_ = local_188._6_2_;
    uStack_154._2_2_ = local_68._6_2_;
    uStack_150._0_2_ = local_188._4_2_;
    uStack_150._2_2_ = local_68._4_2_;
    uStack_14c._0_2_ = local_188._6_2_;
    uStack_14c._2_2_ = local_68._6_2_;
  }
  else {
    qcoeff1 = (__m128i *)local_a8;
    palVar18 = (__m128i *)local_b8;
    piVar20 = &log_scale;
    local_188._2_2_ = local_68._0_2_;
    local_188._4_2_ = uVar10;
    local_188._6_2_ = local_68._2_2_;
    local_188._8_2_ = uVar11;
    local_188._10_2_ = local_68._4_2_;
    local_188._12_2_ = uVar12;
    local_188._14_2_ = local_68._6_2_;
    local_1a8 = auVar28;
    local_178 = auVar34;
    _local_148 = (__m128i)auVar30;
    highbd_calculate_qcoeff((__m128i *)&local_128,qcoeff1,(__m128i *)local_e8,palVar18,piVar20);
    local_a8._4_4_ = local_118._4_4_;
    local_a8._0_4_ = uStack_110;
    uStack_a0 = uStack_110;
    uStack_9c = local_118._4_4_;
    local_e8._4_4_ = uStack_154;
    local_e8._0_4_ = uStack_150;
    uStack_e0 = uStack_150;
    uStack_dc = uStack_154;
    local_b8._4_4_ = local_108._4_4_;
    local_b8._0_4_ = uStack_100;
    uStack_b0 = uStack_100;
    uStack_ac = local_108._4_4_;
    highbd_calculate_qcoeff((__m128i *)&local_138,qcoeff1,(__m128i *)local_e8,palVar18,piVar20);
    local_1a8._0_4_ = local_1a8._0_4_ & (local_138 ^ local_78) - local_78;
    local_1a8._4_4_ = local_1a8._4_4_ & (uStack_134 ^ uStack_74) - uStack_74;
    local_1a8._8_4_ = local_1a8._8_4_ & (uStack_130 ^ uStack_70) - uStack_70;
    local_1a8._12_4_ = local_1a8._12_4_ & (uStack_12c ^ uStack_6c) - uStack_6c;
    *qcoeff_ptr = local_178._0_4_ & (local_128 ^ local_88) - local_88;
    qcoeff_ptr[1] = local_178._4_4_ & (uStack_124 ^ uStack_84) - uStack_84;
    qcoeff_ptr[2] = local_178._8_4_ & (uStack_120 ^ uStack_80) - uStack_80;
    qcoeff_ptr[3] = local_178._12_4_ & (uStack_11c ^ uStack_7c) - uStack_7c;
    qcoeff_ptr[4] = local_1a8._0_4_;
    qcoeff_ptr[5] = local_1a8._4_4_;
    qcoeff_ptr[6] = local_1a8._8_4_;
    qcoeff_ptr[7] = local_1a8._12_4_;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = qcoeff1;
    alVar42[1] = (longlong)palVar18;
    alVar42[0] = extraout_RDX;
    iVar13 = (int)piVar20;
    alVar42 = highbd_calculate_dqcoeff((__m128i)(auVar30 << 0x40),alVar42,iVar13);
    dequant[0] = alVar42[1];
    local_178._8_8_ = extraout_XMM0_Qb;
    local_178._0_8_ = extraout_XMM0_Qa;
    uStack_154 = local_188._4_4_;
    local_158 = (undefined1  [4])local_188._8_4_;
    uStack_150 = local_188._8_4_;
    uStack_14c = local_188._4_4_;
    qcoeff0 = (__m128i *)0x0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = qcoeff1;
    dequant[1] = (longlong)palVar18;
    highbd_calculate_dqcoeff((__m128i)(auVar3 << 0x40),dequant,iVar13);
    *(undefined8 *)dqcoeff_ptr = local_178._0_8_;
    *(undefined8 *)(dqcoeff_ptr + 2) = local_178._8_8_;
    auVar30 = (undefined1  [16])_local_148;
    uVar22 = extraout_XMM0_Qa_00;
    uVar26 = extraout_XMM0_Qb_00;
  }
  local_148._0_2_ = (ushort)(-1 < auVar30._0_2_) * auVar30._0_2_;
  local_148._2_2_ = (ushort)(-1 < auVar30._2_2_) * auVar30._2_2_;
  uStack_144 = (ushort)(-1 < auVar30._4_2_) * auVar30._4_2_;
  uStack_142 = (ushort)(-1 < auVar30._6_2_) * auVar30._6_2_;
  uStack_140 = (ushort)(-1 < auVar30._8_2_) * auVar30._8_2_;
  uStack_13e = (ushort)(-1 < auVar30._10_2_) * auVar30._10_2_;
  uStack_13c = (ushort)(-1 < auVar30._12_2_) * auVar30._12_2_;
  uStack_13a = (ushort)(-1 < auVar30._14_2_) * auVar30._14_2_;
  *(undefined8 *)(dqcoeff_ptr + 4) = uVar22;
  *(undefined8 *)(dqcoeff_ptr + 6) = uVar26;
  lVar16 = 8;
  lVar21 = 0x10;
  while( true ) {
    if (local_90 <= lVar16) break;
    puVar1 = (uint *)(local_160 + lVar16);
    puVar2 = (uint *)(local_160 + lVar16 + 4);
    local_108._0_4_ = (int)*puVar1 >> 0x1f;
    local_108._4_4_ = (int)puVar1[1] >> 0x1f;
    uStack_100 = (int)puVar1[2] >> 0x1f;
    uStack_fc = (int)puVar1[3] >> 0x1f;
    local_178._0_4_ = (int)*puVar2 >> 0x1f;
    local_178._4_4_ = (int)puVar2[1] >> 0x1f;
    local_178._8_4_ = (int)puVar2[2] >> 0x1f;
    local_178._12_4_ = (int)puVar2[3] >> 0x1f;
    local_128 = (*puVar1 ^ local_108._0_4_) - local_108._0_4_;
    uStack_124 = (puVar1[1] ^ local_108._4_4_) - local_108._4_4_;
    uStack_120 = (puVar1[2] ^ uStack_100) - uStack_100;
    uStack_11c = (puVar1[3] ^ uStack_fc) - uStack_fc;
    local_188._4_4_ = uStack_124;
    local_188._0_4_ = local_128;
    local_188._8_4_ = uStack_120;
    local_188._12_4_ = uStack_11c;
    local_138 = (*puVar2 ^ local_178._0_4_) - local_178._0_4_;
    uStack_134 = (puVar2[1] ^ local_178._4_4_) - local_178._4_4_;
    uStack_130 = (puVar2[2] ^ local_178._8_4_) - local_178._8_4_;
    uStack_12c = (puVar2[3] ^ local_178._12_4_) - local_178._12_4_;
    local_1a8._4_4_ = uStack_134;
    local_1a8._0_4_ = local_138;
    local_1a8._8_4_ = uStack_130;
    local_1a8._12_4_ = uStack_12c;
    qcoeff1 = (__m128i *)&local_138;
    qcoeff0 = (__m128i *)&local_128;
    highbd_update_mask0((__m128i *)&local_128,qcoeff1,threshold,(int16_t *)((long)iscan + lVar21),
                        &is_found0,&mask0);
    auVar33._0_4_ = -(uint)((int)local_d8._0_4_ < (int)local_188._0_4_);
    auVar33._4_4_ = -(uint)((int)local_d8._4_4_ < (int)local_188._4_4_);
    auVar33._8_4_ = -(uint)((int)local_d8._8_4_ < (int)local_188._8_4_);
    auVar33._12_4_ = -(uint)((int)local_d8._12_4_ < (int)local_188._12_4_);
    auVar27._0_4_ = -(uint)((int)local_d8._0_4_ < (int)local_1a8._0_4_);
    auVar27._4_4_ = -(uint)((int)local_d8._4_4_ < (int)local_1a8._4_4_);
    auVar27._8_4_ = -(uint)((int)local_d8._8_4_ < (int)local_1a8._8_4_);
    auVar27._12_4_ = -(uint)((int)local_d8._12_4_ < (int)local_1a8._12_4_);
    auVar30 = packssdw(auVar33,auVar27);
    uVar5 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
            (ushort)(byte)(auVar30[0xf] >> 7) << 0xf;
    uVar14 = (uint)uVar5;
    if (uVar5 == 0) {
      alVar32[0] = 0;
      alVar32[1] = 0;
    }
    else {
      alVar32 = (__m128i)(auVar30 & *(undefined1 (*) [16])(iscan + lVar16));
      uVar14 = 1;
      local_1b0 = uVar14;
    }
    iVar13 = movmskps(uVar14,auVar27 | auVar33);
    if (iVar13 == 0) {
      *(undefined1 (*) [16])(qcoeff_ptr + lVar16 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar16) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + lVar16 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + lVar16) = (undefined1  [16])0x0;
    }
    else {
      qcoeff1 = (__m128i *)local_a8;
      palVar18 = (__m128i *)local_b8;
      piVar20 = &log_scale;
      local_1a8 = auVar27;
      local_188 = auVar33;
      _local_118 = alVar32;
      highbd_calculate_qcoeff((__m128i *)&local_128,qcoeff1,(__m128i *)local_e8,palVar18,piVar20);
      highbd_calculate_qcoeff((__m128i *)&local_138,qcoeff1,(__m128i *)local_e8,palVar18,piVar20);
      local_128 = local_188._0_4_ & (local_128 ^ local_108._0_4_) - local_108._0_4_;
      uStack_124 = local_188._4_4_ & (uStack_124 ^ local_108._4_4_) - local_108._4_4_;
      uStack_120 = local_188._8_4_ & (uStack_120 ^ uStack_100) - uStack_100;
      uStack_11c = local_188._12_4_ & (uStack_11c ^ uStack_fc) - uStack_fc;
      local_138 = local_1a8._0_4_ & (local_138 ^ local_178._0_4_) - local_178._0_4_;
      uStack_134 = local_1a8._4_4_ & (uStack_134 ^ local_178._4_4_) - local_178._4_4_;
      uStack_130 = local_1a8._8_4_ & (uStack_130 ^ local_178._8_4_) - local_178._8_4_;
      uStack_12c = local_1a8._12_4_ & (uStack_12c ^ local_178._12_4_) - local_178._12_4_;
      local_1a8._4_4_ = uStack_134;
      local_1a8._0_4_ = local_138;
      local_1a8._8_4_ = uStack_130;
      local_1a8._12_4_ = uStack_12c;
      puVar1 = (uint *)(qcoeff_ptr + lVar16);
      *puVar1 = local_128;
      puVar1[1] = uStack_124;
      puVar1[2] = uStack_120;
      puVar1[3] = uStack_11c;
      puVar1 = (uint *)(qcoeff_ptr + lVar16 + 4);
      *puVar1 = local_138;
      puVar1[1] = uStack_134;
      puVar1[2] = uStack_130;
      puVar1[3] = uStack_12c;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = qcoeff1;
      dequant_00[1] = (longlong)palVar18;
      dequant_00[0] = extraout_RDX_00;
      iVar13 = (int)piVar20;
      alVar42 = highbd_calculate_dqcoeff((__m128i)(auVar6 << 0x40),dequant_00,iVar13);
      dequant_01[0] = alVar42[1];
      local_188._8_8_ = extraout_XMM0_Qb_01;
      local_188._0_8_ = extraout_XMM0_Qa_01;
      qcoeff0 = (__m128i *)0x0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = qcoeff1;
      dequant_01[1] = (longlong)palVar18;
      highbd_calculate_dqcoeff((__m128i)(auVar7 << 0x40),dequant_01,iVar13);
      *(undefined8 *)(dqcoeff_ptr + lVar16) = local_188._0_8_;
      *(undefined8 *)(dqcoeff_ptr + lVar16 + 2) = local_188._8_8_;
      *(undefined8 *)(dqcoeff_ptr + lVar16 + 4) = extraout_XMM0_Qa_02;
      *(undefined8 *)(dqcoeff_ptr + lVar16 + 4 + 2) = extraout_XMM0_Qb_02;
      alVar32 = _local_118;
    }
    sVar4 = (short)alVar32[0];
    local_148._0_2_ =
         (ushort)((short)local_148._0_2_ < sVar4) * sVar4 |
         (ushort)((short)local_148._0_2_ >= sVar4) * local_148._0_2_;
    sVar4 = alVar32[0]._2_2_;
    local_148._2_2_ =
         (ushort)((short)local_148._2_2_ < sVar4) * sVar4 |
         (ushort)((short)local_148._2_2_ >= sVar4) * local_148._2_2_;
    sVar4 = alVar32[0]._4_2_;
    uStack_144 = (ushort)((short)uStack_144 < sVar4) * sVar4 |
                 ((short)uStack_144 >= sVar4) * uStack_144;
    sVar4 = alVar32[0]._6_2_;
    uStack_142 = (ushort)((short)uStack_142 < sVar4) * sVar4 |
                 ((short)uStack_142 >= sVar4) * uStack_142;
    sVar4 = (short)alVar32[1];
    uStack_140 = (ushort)((short)uStack_140 < sVar4) * sVar4 |
                 ((short)uStack_140 >= sVar4) * uStack_140;
    sVar4 = alVar32[1]._2_2_;
    uStack_13e = (ushort)((short)uStack_13e < sVar4) * sVar4 |
                 ((short)uStack_13e >= sVar4) * uStack_13e;
    sVar4 = alVar32[1]._4_2_;
    uStack_13c = (ushort)((short)uStack_13c < sVar4) * sVar4 |
                 ((short)uStack_13c >= sVar4) * uStack_13c;
    sVar4 = alVar32[1]._6_2_;
    uStack_13a = (ushort)((short)uStack_13a < sVar4) * sVar4 |
                 ((short)uStack_13a >= sVar4) * uStack_13a;
    lVar16 = lVar16 + 8;
    lVar21 = lVar21 + 0x10;
  }
  if (is_found0 == 0) {
    uVar14 = 0;
  }
  else {
    mask[1] = (longlong)qcoeff1;
    mask[0] = (longlong)qcoeff0;
    uVar14 = calculate_non_zero_count(mask);
  }
  if (local_1b0 == 0) {
    uVar15 = 0xffffffff;
  }
  else {
    mask_00[1] = (longlong)qcoeff1;
    mask_00[0] = (longlong)qcoeff0;
    iVar13 = calculate_non_zero_count(mask_00);
    uVar15 = iVar13 - 1;
  }
  for (; (int)uVar14 <= (int)uVar15; uVar15 = uVar15 - 1) {
    sVar4 = scan[uVar15];
    qcoeff_ptr[sVar4] = 0;
    dqcoeff_ptr[sVar4] = 0;
  }
  uVar15 = uVar14 + 1;
  uVar19 = (ulong)uVar14;
  do {
    if ((long)uVar19 < 1) {
      uVar15 = 0;
      break;
    }
    lVar16 = uVar19 - 1;
    uVar19 = uVar19 - 1;
    uVar15 = uVar15 - 1;
  } while (qcoeff_ptr[scan[lVar16]] == 0);
  *eob_ptr = (uint16_t)uVar15;
  uVar19 = 0;
  uVar17 = 0xffffffff;
  do {
    if (uVar14 == uVar19) {
LAB_002c37d5:
      if (((uint16_t)uVar15 != 0) && (uVar17 == (uVar15 & 0xffff) - 1)) {
        sVar4 = scan[uVar17];
        if (((qcoeff_ptr[sVar4] == 1) || (qcoeff_ptr[sVar4] == -1)) &&
           (uVar14 = local_160[sVar4] >> 0x1f, uVar19 = (ulong)((uint)(sVar4 != 0) * 2),
           (int)((local_160[sVar4] << 5 ^ uVar14) - uVar14) <
           *(short *)((long)local_98 + uVar19) * 0x20 +
           (*(short *)((long)dequant_ptr + uVar19) * 0x20d + 0x40 >> 7))) {
          qcoeff_ptr[sVar4] = 0;
          dqcoeff_ptr[sVar4] = 0;
          *eob_ptr = 0;
        }
      }
      return;
    }
    if (qcoeff_ptr[scan[uVar19]] != 0) {
      uVar17 = (uint)uVar19;
      goto LAB_002c37d5;
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void aom_highbd_quantize_b_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 8;
  const int log_scale = 0;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, cmp_mask;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  __m128i zbin_sign = _mm_srai_epi16(zbin, 15);
  __m128i round_sign = _mm_srai_epi16(round, 15);
  __m128i quant_sign = _mm_srai_epi16(quant, 15);
  __m128i dequant_sign = _mm_srai_epi16(dequant, 15);
  __m128i shift_sign = _mm_srai_epi16(shift, 15);

  zbin = _mm_unpacklo_epi16(zbin, zbin_sign);
  round = _mm_unpacklo_epi16(round, round_sign);
  quant = _mm_unpacklo_epi16(quant, quant_sign);
  dequant = _mm_unpacklo_epi16(dequant, dequant_sign);
  shift = _mm_unpacklo_epi16(shift, shift_sign);
  zbin = _mm_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm_load_si128((__m128i *)(coeff_ptr));
  coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + 4));

  coeff0_sign = _mm_srai_epi32(coeff0, 31);
  coeff1_sign = _mm_srai_epi32(coeff1, 31);
  qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

  highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
  highbd_update_mask1(&cmp_mask, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), coeff1);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm_load_si128((__m128i *)(coeff_ptr + index));
    coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + index + 4));

    coeff0_sign = _mm_srai_epi32(coeff0, 31);
    coeff1_sign = _mm_srai_epi32(coeff1, 31);
    qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

    highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index,
                        &is_found0, &mask0);

    cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
    highbd_update_mask1(&cmp_mask, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      index += 8;
      continue;
    }
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr + index), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);

    _mm_store_si128((__m128i *)(dqcoeff_ptr + index), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), coeff1);

    index += 8;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}